

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTWeather.cpp
# Opt level: O0

bool __thiscall
LTWeatherVisitor::visitTemperatureGroup
          (LTWeatherVisitor *this,TemperatureGroup *tg,ReportPart param_3,string *param_4)

{
  bool bVar1;
  Type TVar2;
  optional<float> *this_00;
  float *__u;
  TemperatureGroup *in_RSI;
  long in_RDI;
  Temperature TVar3;
  float *in_stack_ffffffffffffff00;
  Temperature *in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff20;
  Unit unit;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff3c;
  undefined1 uVar4;
  float in_stack_ffffffffffffff40;
  _Storage<int,_true> val;
  float in_stack_ffffffffffffff44;
  float alt_m;
  undefined2 in_stack_ffffffffffffff48;
  undefined2 uVar5;
  undefined2 in_stack_ffffffffffffff4a;
  undefined2 uVar6;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  _Storage<int,_true> _Var7;
  
  unit = (Unit)((ulong)in_stack_ffffffffffffff20 >> 0x20);
  uVar4 = (undefined1)((uint)in_stack_ffffffffffffff3c >> 0x18);
  TVar2 = metaf::TemperatureGroup::type(in_RSI);
  if (TVar2 == TEMPERATURE_AND_DEW_POINT) {
    metaf::TemperatureGroup::airTemperature(in_RSI);
    metaf::Temperature::temperature(in_stack_ffffffffffffff08);
    bVar1 = std::optional<float>::has_value((optional<float> *)0x26a777);
    if (bVar1) {
      unit = (Unit)((ulong)(*(long *)(in_RDI + 8) + 0x234) >> 0x20);
      in_stack_ffffffffffffff2c = *(undefined4 *)(in_RDI + 0x10);
      metaf::TemperatureGroup::airTemperature(in_RSI);
      metaf::Temperature::toUnit
                ((Temperature *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),unit);
      std::optional<float>::value_or<float>
                ((optional<float> *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
      LTWeather::FillUp((array<float,_13UL> *)
                        CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                        (array<float,_13UL> *)
                        CONCAT44(in_stack_ffffffffffffff4c,
                                 CONCAT22(in_stack_ffffffffffffff4a,in_stack_ffffffffffffff48)),
                        in_stack_ffffffffffffff44,in_stack_ffffffffffffff40,(bool)uVar4);
    }
    metaf::TemperatureGroup::dewPoint(in_RSI);
    metaf::Temperature::temperature(in_stack_ffffffffffffff08);
    bVar1 = std::optional<float>::has_value((optional<float> *)0x26a897);
    if (bVar1) {
      __u = (float *)(*(long *)(in_RDI + 8) + 0x200);
      this_00 = (optional<float> *)(*(long *)(in_RDI + 8) + 0x1cc);
      TVar3 = metaf::TemperatureGroup::dewPoint(in_RSI);
      val._M_value = TVar3.tempValue.super__Optional_base<int,_true,_true>._M_payload.
                     super__Optional_payload_base<int>._M_payload;
      alt_m = TVar3.tempValue.super__Optional_base<int,_true,_true>._M_payload.
              super__Optional_payload_base<int>._4_4_;
      uVar5 = TVar3._8_2_;
      uVar6 = TVar3._10_2_;
      _Var7._M_value = val._M_value;
      metaf::Temperature::toUnit
                ((Temperature *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),unit);
      uVar4 = 0x7f;
      std::optional<float>::value_or<float>(this_00,__u);
      LTWeather::FillUp((array<float,_13UL> *)CONCAT44(_Var7._M_value,in_stack_ffffffffffffff50),
                        (array<float,_13UL> *)
                        CONCAT44(in_stack_ffffffffffffff4c,CONCAT22(uVar6,uVar5)),alt_m,(float)val,
                        (bool)uVar4);
    }
  }
  return false;
}

Assistant:

bool visitTemperatureGroup(const TemperatureGroup& tg,
                               ReportPart, const std::string&) override
    {
        if (tg.type() == TemperatureGroup::Type::TEMPERATURE_AND_DEW_POINT) {
            // Temperatur: Fill the same temp all the way up to field altitude, which wouldn't be quite right...but under us is ground anyway
            if (tg.airTemperature().temperature().has_value())
                w.FillUp(w.temperature_altitude_msl_m, w.temperatures_aloft_deg_c,
                         fieldAlt_m,
                         tg.airTemperature().toUnit(Temperature::Unit::C).value_or(NAN),
                         true);
            // Dew Point: Fill the same temp all the way up to field altitude, which wouldn't be quite right...but under us is ground anyway
            if (tg.dewPoint().temperature().has_value())
                w.FillUp(w.temperature_altitude_msl_m, w.dewpoint_deg_c,
                         fieldAlt_m,
                         tg.dewPoint().toUnit(Temperature::Unit::C).value_or(NAN),
                         true);
        }
        return false;
    }